

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O3

bool wasm::optimizeBlock(Block *curr,Module *module,PassOptions *passOptions,
                        BranchSeekerCache *branchInfo)

{
  Id IVar1;
  char *pcVar2;
  size_t sVar3;
  Module *pMVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined1 extraout_AL;
  undefined7 uVar10;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *this;
  const_iterator cVar7;
  Expression **ppEVar8;
  Drop *this_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar9;
  ulong uVar11;
  Expression *pEVar12;
  ulong uVar13;
  Expression *pEVar14;
  Expression *pEVar15;
  Block *pBVar16;
  uint uVar17;
  size_t j;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *pAVar18;
  Index j_1;
  SmallVector<wasm::Expression_*,_10UL> *pSVar19;
  uint uVar20;
  long lVar21;
  SmallVector<wasm::Expression_*,_10UL> *pSVar22;
  Block *block;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Name target;
  undefined1 local_138 [8];
  SmallVector<wasm::Expression_*,_10UL> merged;
  Builder builder;
  Block *local_98;
  Expression *child;
  ulong local_88;
  MixedArena *local_80;
  Expression *local_78;
  long local_70;
  Block *local_68;
  ulong local_60;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *local_58;
  Block *local_50;
  ulong local_48;
  Expression *local_40;
  uint local_34;
  
  pAVar18 = (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&curr->list;
  local_80 = &module->allocator;
  local_60 = 0;
  merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)passOptions;
  child = (Expression *)branchInfo;
  local_58 = pAVar18;
  local_50 = curr;
LAB_0095cfcd:
  uVar13 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
           usedElements;
  do {
    if (uVar13 == 0) break;
    local_70 = 8;
    local_88 = 0;
    uVar11 = 0;
    do {
      local_98 = *(Block **)(*(long *)pAVar18 + uVar11 * 8);
      IVar1 = (((SpecificExpression<(wasm::Expression::Id)18> *)
               &local_98->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id;
      local_48 = uVar11;
      if (IVar1 == BlockId) {
        pBVar16 = (Block *)0x0;
        block = local_98;
LAB_0095d094:
        pEVar14 = (Expression *)
                  (block->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                  usedElements;
        if (pEVar14 != (Expression *)0x0) {
          if (pEVar14 == (Expression *)0x1) {
LAB_0095d0ab:
            pcVar2 = (block->name).super_IString.str._M_str;
            uVar20 = 0;
            local_68 = pBVar16;
            local_40 = pEVar14;
            if (pcVar2 == (char *)0x0) {
              uVar13 = (ulong)pEVar14 & 0xffffffff;
            }
            else {
              pAVar18 = local_58;
              if (1 < (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.
                      type.id) goto LAB_0095d229;
              sVar3 = (block->name).super_IString.str._M_len;
              uVar13 = 0;
              do {
                if ((block->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements <= uVar13) goto LAB_0095d53f;
                local_138 = (undefined1  [8])sVar3;
                merged.usedFixed = (size_t)pcVar2;
                this = &BranchUtils::BranchSeekerCache::getBranches
                                  ((BranchSeekerCache *)child,
                                   (block->list).
                                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                   .data[uVar13])->_M_t;
                cVar7 = std::
                        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                        ::find(this,(key_type *)local_138);
                curr = local_50;
                if ((_Rb_tree_header *)cVar7._M_node != &(this->_M_impl).super__Rb_tree_header) {
                  uVar20 = (uint)local_40;
                  goto LAB_0095d187;
                }
                uVar13 = uVar13 + 1;
              } while (local_40 != (Expression *)uVar13);
              uVar13 = (ulong)local_40 & 0xffffffff;
              uVar20 = 0;
            }
LAB_0095d187:
            uVar17 = (uint)uVar13;
            local_34 = uVar20;
            if (local_68 == (Block *)0x0) {
              pEVar14 = (Expression *)(ulong)uVar20;
            }
            else {
              local_78 = (Expression *)(local_68->name).super_IString.str._M_len;
              pcVar2 = (local_68->name).super_IString.str._M_str;
              uVar13 = (ulong)local_40 & 0xffffffff;
              uVar20 = (int)local_40 + 1;
              do {
                uVar13 = uVar13 - 1;
                if ((int)(uint)uVar13 < 0) goto LAB_0095d1ee;
                uVar11 = (ulong)((uint)uVar13 & 0x7fffffff);
                if ((block->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements <= uVar11) goto LAB_0095d53f;
                ppEVar8 = (block->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .data;
                target.super_IString.str._M_str = (char *)ppEVar8;
                target.super_IString.str._M_len = (size_t)pcVar2;
                bVar5 = BranchUtils::BranchSeeker::has
                                  ((BranchSeeker *)ppEVar8[uVar11],local_78,target);
                uVar20 = uVar20 - 1;
              } while (!bVar5);
              if (local_34 < uVar20) {
                local_34 = uVar20;
              }
              uVar17 = 0;
LAB_0095d1ee:
              pEVar14 = (Expression *)(ulong)local_34;
              curr = local_50;
              if (pEVar14 < local_40) {
                sVar3 = (block->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                        usedElements;
                if (sVar3 == 0) {
                  __assert_fail("usedElements > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                ,0xd0,
                                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                               );
                }
                pAVar18 = local_58;
                if (1 < ((block->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         data[sVar3 - 1]->type).id) goto LAB_0095d229;
              }
            }
            if ((uVar17 != 0) || (pAVar18 = local_58, local_40 != pEVar14)) {
              local_138 = (undefined1  [8])0x0;
              merged.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              merged.fixed._M_elems[9] = (Expression *)0x0;
              merged.flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              if (local_48 == 0) goto LAB_0095d2a9;
              lVar21 = 0;
              uVar13 = 0;
              goto LAB_0095d278;
            }
          }
          else {
            ppEVar8 = (block->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data;
            if (((*ppEVar8)->type).id != 1) {
              pEVar15 = (Expression *)0x2;
              do {
                pEVar12 = pEVar15;
                if (pEVar14 == pEVar12) break;
                pEVar15 = (Expression *)&pEVar12->field_0x1;
              } while ((ppEVar8[(long)((long)&pEVar12[-1].type.id + 7)]->type).id != 1);
              if (pEVar14 <= pEVar12) goto LAB_0095d0ab;
            }
          }
        }
      }
      else if (IVar1 == LoopId) {
        block = (Block *)(local_98->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         data;
        pBVar16 = local_98;
        if ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
            BlockId) goto LAB_0095d094;
      }
      else if (((IVar1 == DropId) &&
               (block = (Block *)(local_98->name).super_IString.str._M_len,
               (block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id ==
               BlockId)) &&
              (bVar5 = optimizeDroppedBlock
                                 ((Drop *)local_98,block,module,
                                  (PassOptions *)
                                  merged.flexible.
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (BranchSeekerCache *)child), bVar5)) {
        if (local_48 <
            (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements) {
          lVar21 = *(long *)pAVar18;
          *(Block **)(lVar21 + local_48 * 8) = block;
          uVar10 = (undefined7)((ulong)lVar21 >> 8);
          local_60 = CONCAT71(uVar10,1);
          local_88 = CONCAT71(uVar10,1);
          pBVar16 = (Block *)0x0;
          local_98 = block;
          goto LAB_0095d094;
        }
        goto LAB_0095d53f;
      }
LAB_0095d229:
      uVar11 = local_48 + 1;
      uVar13 = (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      local_70 = local_70 + 8;
    } while (uVar11 < uVar13);
  } while ((local_88 & 1) != 0);
  uVar6 = (undefined1)uVar13;
  if ((local_60 & 1) != 0) {
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)
         (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
    Block::finalize(curr,type__01,Unknown);
    uVar6 = extraout_AL;
  }
  return (bool)uVar6;
  while( true ) {
    SmallVector<wasm::Expression_*,_10UL>::push_back
              ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
               (Expression **)(*(long *)local_58 + lVar21));
    uVar13 = uVar13 + 1;
    lVar21 = lVar21 + 8;
    if (local_48 == uVar13) break;
LAB_0095d278:
    if ((local_50->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements <= uVar13) goto LAB_0095d53f;
  }
LAB_0095d2a9:
  uVar13 = (ulong)uVar17;
  if (uVar17 != 0) {
    uVar11 = 0;
    do {
      if ((block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar11) goto LAB_0095d53f;
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
                 (block->list).
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data +
                 uVar11);
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar13);
  }
  pAVar18 = local_58;
  pBVar16 = local_50;
  if (uVar17 < local_34) {
    SmallVector<wasm::Expression_*,_10UL>::push_back
              ((SmallVector<wasm::Expression_*,_10UL> *)local_138,(Expression **)&local_98);
    pBVar16 = local_50;
    pAVar18 = local_58;
    builder.wasm = (Module *)0x0;
    do {
      if ((block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= uVar13) goto LAB_0095d53f;
      pEVar15 = (block->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                [uVar13];
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&builder,
                 pEVar15);
      uVar13 = uVar13 + 1;
    } while (pEVar14 != (Expression *)uVar13);
    if (pEVar14 < local_40) {
      local_34 = local_34 + 1;
      do {
        if ((Expression *)
            (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .usedElements <= pEVar14) {
LAB_0095d53f:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        pEVar15 = (Expression *)
                  ((block->list).
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data +
                  (long)pEVar14);
        SmallVector<wasm::Expression_*,_10UL>::push_back
                  ((SmallVector<wasm::Expression_*,_10UL> *)local_138,(Expression **)pEVar15);
        pEVar14 = (Expression *)(ulong)local_34;
        local_34 = local_34 + 1;
      } while (pEVar14 < local_40);
    }
    pMVar4 = (Module *)
             (block->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
    (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
         (Expression **)builder.wasm;
    (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (block->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar15;
    builder.wasm = pMVar4;
    Block::finalize(block,type_,Unknown);
    if (local_68 != (Block *)0x0) {
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar15;
      Loop::finalize((Loop *)local_68,type__00);
    }
  }
  while (local_48 = local_48 + 1,
        local_48 <
        (pBVar16->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        usedElements) {
    lVar21 = local_70 + 8;
    SmallVector<wasm::Expression_*,_10UL>::push_back
              ((SmallVector<wasm::Expression_*,_10UL> *)local_138,
               (Expression **)(local_70 + *(long *)pAVar18));
    local_70 = lVar21;
  }
  if (((long)merged.flexible.
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start - (long)merged.fixed._M_elems[9] >> 3) +
      (long)local_138 != 0) {
    ppEVar8 = SmallVector<wasm::Expression_*,_10UL>::back
                        ((SmallVector<wasm::Expression_*,_10UL> *)local_138);
    local_48 = ((long)merged.flexible.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)merged.fixed._M_elems[9] >> 3
               ) + (long)local_138;
    if (local_48 != 0) {
      local_40 = *ppEVar8;
      lVar21 = -0x50;
      pSVar19 = &merged;
      uVar13 = 0;
      do {
        pSVar22 = (SmallVector<wasm::Expression_*,_10UL> *)(&merged.fixed._M_elems[9]->_id + lVar21)
        ;
        if (uVar13 < 10) {
          pSVar22 = pSVar19;
        }
        pEVar14 = (Expression *)pSVar22->usedFixed;
        if ((pEVar14 != local_40) && (1 < (pEVar14->type).id)) {
          local_78 = pEVar14;
          this_00 = (Drop *)MixedArena::allocSpace(local_80,0x18,8);
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id =
               DropId;
          (this_00->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0
          ;
          this_00->value = local_78;
          Drop::finalize(this_00);
          pSVar22->usedFixed = (size_t)this_00;
        }
        uVar13 = uVar13 + 1;
        pSVar19 = (SmallVector<wasm::Expression_*,_10UL> *)&pSVar19->fixed;
        lVar21 = lVar21 + 8;
      } while (local_48 != uVar13);
    }
  }
  pAVar18 = local_58;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<wasm::SmallVector<wasm::Expression*,10ul>>
            (local_58,(SmallVector<wasm::Expression_*,_10UL> *)local_138);
  curr = local_50;
  uVar9 = extraout_RAX;
  if (merged.fixed._M_elems[9] != (Expression *)0x0) {
    operator_delete(merged.fixed._M_elems[9],
                    (long)merged.flexible.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)merged.fixed._M_elems[9]);
    uVar9 = extraout_RAX_00;
  }
  local_60 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
  goto LAB_0095cfcd;
}

Assistant:

static bool optimizeBlock(Block* curr,
                          Module* module,
                          PassOptions& passOptions,
                          BranchUtils::BranchSeekerCache& branchInfo) {
  auto& list = curr->list;
  // Main merging loop.
  bool more = true;
  bool changed = false;
  while (more) {
    more = false;
    for (size_t i = 0; i < list.size(); i++) {
      auto* child = list[i];
      // The child block, if there is one.
      Block* childBlock = child->dynCast<Block>();
      // If we are merging an inner block of a loop, then we must not
      // merge things before and including the name of the loop, moving
      // those out would break things.
      Loop* loop = nullptr;
      // To to handle a non-block child.
      if (!childBlock) {
        // If we have a child that is (drop (block ..)) then we can move the
        // drop into the block, and remove br values. This allows more merging.
        if (auto* drop = list[i]->dynCast<Drop>()) {
          childBlock = drop->value->dynCast<Block>();
          if (childBlock &&
              optimizeDroppedBlock(
                drop, childBlock, *module, passOptions, branchInfo)) {
            child = list[i] = childBlock;
            more = true;
            changed = true;
          } else {
            childBlock = nullptr;
          }
        } else if ((loop = list[i]->dynCast<Loop>())) {
          // We can merge a loop's "tail" - if the body is a block and has
          // instructions at the end that do not branch back.
          childBlock = loop->body->dynCast<Block>();
          // TODO: handle (loop (loop - the bodies of loops may not be blocks
        }
      }
      // If no block, we can't do anything.
      if (!childBlock) {
        continue;
      }
      auto& childList = childBlock->list;
      auto childSize = childList.size();
      if (childSize == 0) {
        continue;
      }
      // If the child has items after an unreachable, ignore it - dce should
      // have been run, and we prefer to not handle the complexity here.
      if (hasDeadCode(childBlock)) {
        continue;
      }
      // In some cases we can remove only the head or the tail of the block,
      // and must keep some things in the child block.
      Index keepStart = childSize;
      Index keepEnd = 0;
      // For a block with a name, we may only be able to remove a head, up
      // to the first item that branches to the block.
      if (childBlock->name.is()) {
        // If it has a concrete value, then breaks may be sending it a value,
        // and we'd need to handle that. TODO
        if (childBlock->type.isConcrete()) {
          continue;
        }
        auto childName = childBlock->name;
        for (size_t j = 0; j < childSize; j++) {
          auto* item = childList[j];
          if (branchInfo.hasBranch(item, childName)) {
            // We can't remove this from the child.
            keepStart = j;
            keepEnd = childSize;
            break;
          }
        }
      }
      // For a loop, we may only be able to remove a tail
      if (loop) {
        auto childName = loop->name;
        for (auto j = int(childSize - 1); j >= 0; j--) {
          auto* item = childList[j];
          if (BranchUtils::BranchSeeker::has(item, childName)) {
            // We can't remove this from the child.
            keepStart = 0;
            keepEnd = std::max(Index(j + 1), keepEnd);
            break;
          }
        }
        // If we can only do part of the block, and if the block has a flowing
        // value, we would need special handling for that - not worth it,
        // probably TODO
        // FIXME is this not handled by the drop later down?
        if (keepEnd < childSize && childList.back()->type.isConcrete()) {
          continue;
        }
      }
      // Maybe there's nothing to do, if we must keep it all in the
      // child anyhow.
      if (keepStart == 0 && keepEnd == childSize) {
        continue;
      }
      // There is something to do!
      bool keepingPart = keepStart < keepEnd;
      // Create a new merged list, and fill in the code before the child block
      // we are merging in. It is efficient to use a small vector here because
      // most blocks are fairly small, and this way we copy once into the arena
      // we use for Block lists a single time at the end (arena allocations
      // can't be freed, so any temporary allocations while we add to the list
      // would end up wasted).
      SmallVector<Expression*, 10> merged;
      for (size_t j = 0; j < i; j++) {
        merged.push_back(list[j]);
      }
      // Add the head of the block - the things at the start we do
      // not need to keep.
      for (Index j = 0; j < keepStart; j++) {
        merged.push_back(childList[j]);
      }
      // If we can't merge it all, keep and filter the child.
      if (keepingPart) {
        merged.push_back(child);
        // Filter the child.
        ExpressionList filtered(module->allocator);
        for (Index j = keepStart; j < keepEnd; j++) {
          filtered.push_back(childList[j]);
        }
        // Add the tail of the block - the things at the end we do
        // not need to keep.
        for (Index j = keepEnd; j < childSize; j++) {
          merged.push_back(childList[j]);
        }
        // Update the child.
        childList.swap(filtered);
        // We may have removed unreachable items.
        childBlock->finalize();
        if (loop) {
          loop->finalize();
        }
        // Note that we modify the child block here, which invalidates info
        // in branchInfo. However, as we have scanned the parent, we have
        // already forgotten the child's info, so there is nothing to do here
        // for the child.
        // (We also don't need to do anything for the parent - we move code
        // from a child into the parent, but that doesn't change the total
        // branches in the parent.)
      }
      // Add the rest of the parent block after the child.
      for (size_t j = i + 1; j < list.size(); j++) {
        merged.push_back(list[j]);
      }
      // if we merged a concrete element in the middle, drop it
      if (!merged.empty()) {
        auto* last = merged.back();
        for (auto*& item : merged) {
          if (item != last && item->type.isConcrete()) {
            Builder builder(*module);
            item = builder.makeDrop(item);
          }
        }
      }
      list.set(merged);
      more = true;
      changed = true;
      break;
    }
  }
  if (changed) {
    curr->finalize(curr->type);
  }
  return changed;
}